

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void enter_room(tgestate_t *state)

{
  room_t room_index;
  int iVar1;
  uint uVar2;
  int iVar3;
  object_t oVar4;
  uint uVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  
  (state->game_window_offset).x = '\0';
  (state->game_window_offset).y = '\0';
  setup_room(state);
  plot_interior_tiles(state);
  (state->map_position).x = 't';
  (state->map_position).y = 0xea;
  set_hero_sprite_for_room(state);
  calc_vischar_isopos_from_vischar(state,state->vischars);
  setup_movable_items(state);
  zoombox(state);
  increase_score(state,'\x01');
  squash_stack_goto_main(state);
  memset(state->tile_buf,0,state->tile_buf_size);
  room_index = state->room_index;
  setup_doors(state);
  iVar1 = get_roomdef(state,room_index,0);
  state->roomdef_dimensions_index = (uint8_t)iVar1;
  uVar2 = get_roomdef(state,room_index,1);
  state->roomdef_object_bounds_count = (uint8_t)uVar2;
  if ((uint8_t)uVar2 == '\0') {
    iVar1 = 2;
  }
  else {
    iVar1 = (uVar2 & 0xff) * 4 + 2;
    for (lVar7 = 0; (uVar2 & 0xff) << 2 != (int)lVar7; lVar7 = lVar7 + 1) {
      iVar3 = get_roomdef(state,room_index,(int)lVar7 + 2);
      (&state->roomdef_object_bounds[0].x0)[lVar7] = (uint8_t)iVar3;
    }
  }
  iVar3 = get_roomdef(state,room_index,iVar1);
  state->interior_mask_data_count = (uint8_t)iVar3;
  lVar7 = 0;
  while( true ) {
    uVar2 = get_roomdef(state,room_index,iVar1 + 1 + (int)lVar7);
    uVar8 = (ulong)uVar2;
    if ((uint8_t)iVar3 == (uint8_t)lVar7) break;
    state->interior_mask_data[lVar7] = setup_room::interior_mask_data_source[uVar8 & 0xff];
    lVar7 = lVar7 + 1;
  }
  iVar1 = iVar1 + (int)lVar7 + 2;
  while (cVar6 = (char)uVar8, uVar8 = (ulong)(byte)(cVar6 - 1), cVar6 != '\0') {
    oVar4 = get_roomdef(state,room_index,iVar1);
    uVar2 = get_roomdef(state,room_index,iVar1 + 1);
    uVar5 = get_roomdef(state,room_index,iVar1 + 2);
    expand_object(state,oVar4 & 0xff,
                  state->tile_buf + (int)((uVar2 & 0xff) + (uVar5 & 0xff) * state->columns));
    iVar1 = iVar1 + 3;
  }
  return;
}

Assistant:

void enter_room(tgestate_t *state)
{
  assert(state != NULL);

  state->game_window_offset.x = 0;
  state->game_window_offset.y = 0;
  // FUTURE: replace with call to setup_room_and_plot
  setup_room(state);
  plot_interior_tiles(state);
  state->map_position.x = 116;
  state->map_position.y = 234;
  set_hero_sprite_for_room(state);
  calc_vischar_isopos_from_vischar(state, &state->vischars[0]);
  setup_movable_items(state);
  zoombox(state);
  increase_score(state, 1);

  squash_stack_goto_main(state); /* was fallthrough */
  NEVER_RETURNS;
}